

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::GetUniqueName(FBXConverter *this,string *name,string *uniqueName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream oVar3;
  ostream *poVar4;
  ostream *poVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar7;
  ostringstream ext;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1e0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
  *local_1b8;
  string *local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1a8 [2];
  ios_base local_138 [264];
  
  std::__cxx11::string::_M_assign((string *)uniqueName);
  paVar1 = &local_1a8[0].first.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_1b0 = name;
  local_1a8[0].first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar2,pcVar2 + name->_M_string_length);
  local_1a8[0].second = 0;
  local_1b8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
               *)&this->mNodeNames;
  pVar6 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                      *)&this->mNodeNames,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].first._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0].first._M_dataplus._M_p,
                    local_1a8[0].first.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    do {
      pVar6.first._M_node._M_node[2]._M_color = pVar6.first._M_node._M_node[2]._M_color + _S_black;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,
                          local_1b0->_M_string_length);
      poVar5 = poVar4 + *(long *)(*(long *)poVar4 + -0x18);
      if (poVar4[*(long *)(*(long *)poVar4 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar5);
        poVar5[0xe0] = oVar3;
        poVar5[0xe1] = (ostream)0x1;
      }
      poVar5[0xe0] = (ostream)0x30;
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)uniqueName,(string *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.first._M_dataplus._M_p != &local_1e0.first.field_2) {
        operator_delete(local_1e0.first._M_dataplus._M_p,
                        local_1e0.first.field_2._M_allocated_capacity + 1);
      }
      local_1e0.first._M_dataplus._M_p = (pointer)&local_1e0.first.field_2;
      pcVar2 = (uniqueName->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar2,pcVar2 + uniqueName->_M_string_length);
      local_1e0.second = 0;
      pVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
                        (local_1b8,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.first._M_dataplus._M_p != &local_1e0.first.field_2) {
        operator_delete(local_1e0.first._M_dataplus._M_p,
                        local_1e0.first.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    } while (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
  }
  return;
}

Assistant:

void FBXConverter::GetUniqueName(const std::string &name, std::string &uniqueName)
        {
            uniqueName = name;
            auto it_pair = mNodeNames.insert({ name, 0 }); // duplicate node name instance count
            unsigned int& i = it_pair.first->second;
            while (!it_pair.second)
            {
                i++;
                std::ostringstream ext;
                ext << name << std::setfill('0') << std::setw(3) << i;
                uniqueName = ext.str();
                it_pair = mNodeNames.insert({ uniqueName, 0 });
            }
        }